

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtSemiCanonicize(word *pTruth,int nVars,char *pCanonPerm,int *pStoreOut,int fOnlySwap)

{
  char cVar1;
  word wVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  int w;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  word *pwVar15;
  word *pwVar16;
  int *pStore;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar51;
  undefined1 auVar48 [16];
  int iVar50;
  int iVar52;
  undefined1 auVar49 [16];
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 in_XMM4 [16];
  int iVar56;
  int pStoreIn [17];
  int local_78 [18];
  
  uVar5 = (ulong)(uint)nVars;
  pStore = local_78;
  if (pStoreOut != (int *)0x0) {
    pStore = pStoreOut;
  }
  bVar8 = (byte)nVars;
  uVar11 = 1 << (bVar8 - 6 & 0x1f);
  if (nVars < 7) {
    uVar11 = 1;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauCanon.c"
                  ,0x24e,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *, int)");
  }
  if (nVars < 1) {
LAB_004d4aca:
    uVar6 = 1 << (bVar8 & 0x1f);
    uVar32 = (ulong)uVar6;
    uVar14 = ~(-1L << ((byte)uVar6 & 0x3f)) & *pTruth;
    if ((uint)nVars < 6) {
      uVar10 = uVar6 * 2;
      uVar12 = (ulong)uVar10;
      uVar7 = 0x40;
      if (0x40 < uVar12) {
        uVar7 = uVar12;
      }
      uVar12 = ((uVar7 - uVar12) - (ulong)(nVars != 5) >> (bVar8 & 0x3f)) + (ulong)(nVars != 5);
      lVar51 = (ulong)uVar6 * 2;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar14;
      auVar30._8_4_ = (int)uVar12;
      auVar30._0_8_ = uVar12;
      auVar30._12_4_ = (int)(uVar12 >> 0x20);
      uVar7 = 0xfffffffffffffffe;
      do {
        auVar21 = auVar19;
        auVar3._8_4_ = (int)uVar14;
        auVar3._0_8_ = uVar14;
        auVar3._12_4_ = (int)(uVar14 >> 0x20);
        auVar20._8_8_ = auVar3._8_8_ << lVar51;
        auVar20._0_8_ = uVar14 << uVar32;
        auVar19 = auVar20 | auVar21;
        uVar32 = uVar32 + uVar10;
        lVar51 = lVar51 + (ulong)uVar10;
        uVar7 = uVar7 + 2;
      } while ((uVar12 & 0xfffffffffffffffe) != uVar7);
      auVar48._8_4_ = (int)uVar7;
      auVar48._0_8_ = uVar7;
      auVar48._12_4_ = (int)(uVar7 >> 0x20);
      auVar30 = auVar30 ^ _DAT_00912220;
      auVar23 = (auVar48 | _DAT_00912210) ^ _DAT_00912220;
      iVar53 = -(uint)(auVar30._0_4_ < auVar23._0_4_);
      iVar54 = -(uint)(auVar30._4_4_ < auVar23._4_4_);
      iVar55 = -(uint)(auVar30._8_4_ < auVar23._8_4_);
      iVar56 = -(uint)(auVar30._12_4_ < auVar23._12_4_);
      iVar50 = -(uint)(auVar23._4_4_ == auVar30._4_4_);
      iVar52 = -(uint)(auVar23._12_4_ == auVar30._12_4_);
      auVar31._4_4_ = iVar50;
      auVar31._0_4_ = iVar50;
      auVar31._8_4_ = iVar52;
      auVar31._12_4_ = iVar52;
      auVar4._4_4_ = iVar53;
      auVar4._0_4_ = iVar53;
      auVar4._8_4_ = iVar55;
      auVar4._12_4_ = iVar55;
      auVar49._4_4_ = iVar54;
      auVar49._0_4_ = iVar54;
      auVar49._8_4_ = iVar56;
      auVar49._12_4_ = iVar56;
      auVar49 = auVar49 | auVar31 & auVar4;
      auVar21 = ~auVar49 & auVar19 | auVar21 & auVar49;
      uVar14 = auVar21._8_8_ | auVar21._0_8_;
    }
    if (*pTruth != uVar14) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  else {
    lVar51 = uVar5 - 1;
    auVar21._8_4_ = (int)lVar51;
    auVar21._0_8_ = lVar51;
    auVar21._12_4_ = (int)((ulong)lVar51 >> 0x20);
    auVar21 = auVar21 ^ _DAT_00912220;
    iVar50 = auVar21._0_4_;
    iVar52 = auVar21._4_4_;
    iVar53 = auVar21._8_4_;
    iVar54 = auVar21._12_4_;
    auVar33._0_4_ = -(uint)(iVar50 < -0x80000000);
    auVar33._4_4_ = -(uint)(iVar50 < -0x80000000);
    auVar33._8_4_ = -(uint)(iVar53 < -0x7fffffff);
    auVar33._12_4_ = -(uint)(iVar53 < -0x7fffffff);
    auVar23._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar23._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar23._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar23._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar23 = auVar23 & auVar33;
    auVar21 = pshuflw(in_XMM4,auVar23,0xe8);
    auVar34._8_4_ = 0xffffffff;
    auVar34._0_8_ = 0xffffffffffffffff;
    auVar34._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar34,auVar21 ^ auVar34);
    if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *pCanonPerm = '\0';
    }
    auVar23 = packssdw(auVar23,auVar23);
    auVar23 = packssdw(auVar23 ^ auVar34,auVar23 ^ auVar34);
    auVar23 = packsswb(auVar23,auVar23);
    if ((auVar23._0_4_ >> 8 & 1) != 0) {
      pCanonPerm[1] = '\x01';
    }
    auVar35._0_4_ = -(uint)(iVar50 < -0x7ffffffe);
    auVar35._4_4_ = -(uint)(iVar50 < -0x7ffffffe);
    auVar35._8_4_ = -(uint)(iVar53 < -0x7ffffffd);
    auVar35._12_4_ = -(uint)(iVar53 < -0x7ffffffd);
    auVar24._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar24._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar24._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar24._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar24 = auVar24 & auVar35;
    auVar21 = packssdw(auVar21,auVar24);
    auVar36._8_4_ = 0xffffffff;
    auVar36._0_8_ = 0xffffffffffffffff;
    auVar36._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar36,auVar21 ^ auVar36);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
      pCanonPerm[2] = '\x02';
    }
    auVar23 = pshufhw(auVar24,auVar24,0x84);
    auVar23 = packssdw(auVar23 ^ auVar36,auVar23 ^ auVar36);
    auVar23 = packsswb(auVar23,auVar23);
    if ((auVar23._0_4_ >> 0x18 & 1) != 0) {
      pCanonPerm[3] = '\x03';
    }
    auVar37._0_4_ = -(uint)(iVar50 < -0x7ffffffc);
    auVar37._4_4_ = -(uint)(iVar50 < -0x7ffffffc);
    auVar37._8_4_ = -(uint)(iVar53 < -0x7ffffffb);
    auVar37._12_4_ = -(uint)(iVar53 < -0x7ffffffb);
    auVar25._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar25._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar25._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar25._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar25 = auVar25 & auVar37;
    auVar21 = pshuflw(auVar21,auVar25,0xe8);
    auVar38._8_4_ = 0xffffffff;
    auVar38._0_8_ = 0xffffffffffffffff;
    auVar38._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar38,auVar21 ^ auVar38);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pCanonPerm[4] = '\x04';
    }
    auVar23 = packssdw(auVar25,auVar25);
    auVar23 = packssdw(auVar23 ^ auVar38,auVar23 ^ auVar38);
    auVar23 = packsswb(auVar23,auVar23);
    if ((auVar23._4_2_ >> 8 & 1) != 0) {
      pCanonPerm[5] = '\x05';
    }
    auVar39._0_4_ = -(uint)(iVar50 < -0x7ffffffa);
    auVar39._4_4_ = -(uint)(iVar50 < -0x7ffffffa);
    auVar39._8_4_ = -(uint)(iVar53 < -0x7ffffff9);
    auVar39._12_4_ = -(uint)(iVar53 < -0x7ffffff9);
    auVar26._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar26._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar26._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar26._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar26 = auVar26 & auVar39;
    auVar21 = packssdw(auVar21,auVar26);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar40,auVar21 ^ auVar40);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pCanonPerm[6] = '\x06';
    }
    auVar23 = pshufhw(auVar26,auVar26,0x84);
    auVar23 = packssdw(auVar23 ^ auVar40,auVar23 ^ auVar40);
    auVar23 = packsswb(auVar23,auVar23);
    if ((auVar23._6_2_ >> 8 & 1) != 0) {
      pCanonPerm[7] = '\a';
    }
    auVar41._0_4_ = -(uint)(iVar50 < -0x7ffffff8);
    auVar41._4_4_ = -(uint)(iVar50 < -0x7ffffff8);
    auVar41._8_4_ = -(uint)(iVar53 < -0x7ffffff7);
    auVar41._12_4_ = -(uint)(iVar53 < -0x7ffffff7);
    auVar27._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar27._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar27._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar27._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar27 = auVar27 & auVar41;
    auVar21 = pshuflw(auVar21,auVar27,0xe8);
    auVar42._8_4_ = 0xffffffff;
    auVar42._0_8_ = 0xffffffffffffffff;
    auVar42._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar42,auVar21 ^ auVar42);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pCanonPerm[8] = '\b';
    }
    auVar23 = packssdw(auVar27,auVar27);
    auVar23 = packssdw(auVar23 ^ auVar42,auVar23 ^ auVar42);
    auVar23 = packsswb(auVar23,auVar23);
    if ((auVar23._8_2_ >> 8 & 1) != 0) {
      pCanonPerm[9] = '\t';
    }
    auVar43._0_4_ = -(uint)(iVar50 < -0x7ffffff6);
    auVar43._4_4_ = -(uint)(iVar50 < -0x7ffffff6);
    auVar43._8_4_ = -(uint)(iVar53 < -0x7ffffff5);
    auVar43._12_4_ = -(uint)(iVar53 < -0x7ffffff5);
    auVar28._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar28._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar28._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar28._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar28 = auVar28 & auVar43;
    auVar21 = packssdw(auVar21,auVar28);
    auVar44._8_4_ = 0xffffffff;
    auVar44._0_8_ = 0xffffffffffffffff;
    auVar44._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar44,auVar21 ^ auVar44);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      pCanonPerm[10] = '\n';
    }
    auVar23 = pshufhw(auVar28,auVar28,0x84);
    auVar23 = packssdw(auVar23 ^ auVar44,auVar23 ^ auVar44);
    auVar23 = packsswb(auVar23,auVar23);
    if ((auVar23._10_2_ >> 8 & 1) != 0) {
      pCanonPerm[0xb] = '\v';
    }
    auVar45._0_4_ = -(uint)(iVar50 < -0x7ffffff4);
    auVar45._4_4_ = -(uint)(iVar50 < -0x7ffffff4);
    auVar45._8_4_ = -(uint)(iVar53 < -0x7ffffff3);
    auVar45._12_4_ = -(uint)(iVar53 < -0x7ffffff3);
    auVar29._0_4_ = -(uint)(iVar52 == -0x80000000);
    auVar29._4_4_ = -(uint)(iVar52 == -0x80000000);
    auVar29._8_4_ = -(uint)(iVar54 == -0x80000000);
    auVar29._12_4_ = -(uint)(iVar54 == -0x80000000);
    auVar29 = auVar29 & auVar45;
    auVar21 = pshuflw(auVar21,auVar29,0xe8);
    auVar46._8_4_ = 0xffffffff;
    auVar46._0_8_ = 0xffffffffffffffff;
    auVar46._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar46,auVar21 ^ auVar46);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pCanonPerm[0xc] = '\f';
    }
    auVar21 = packssdw(auVar29,auVar29);
    auVar21 = packssdw(auVar21 ^ auVar46,auVar21 ^ auVar46);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21._12_2_ >> 8 & 1) != 0) {
      pCanonPerm[0xd] = '\r';
    }
    auVar47._0_4_ = -(uint)(iVar50 < (int)DAT_009aefe0);
    auVar47._4_4_ = -(uint)(iVar50 < (int)DAT_009aefe0);
    auVar47._8_4_ = -(uint)(iVar53 < DAT_009aefe0._8_4_);
    auVar47._12_4_ = -(uint)(iVar53 < DAT_009aefe0._8_4_);
    auVar18._0_4_ = -(uint)(DAT_009aefe0._4_4_ == iVar52);
    auVar18._4_4_ = -(uint)(DAT_009aefe0._4_4_ == iVar52);
    auVar18._8_4_ = -(uint)(DAT_009aefe0._12_4_ == iVar54);
    auVar18._12_4_ = -(uint)(DAT_009aefe0._12_4_ == iVar54);
    auVar18 = auVar18 & auVar47;
    auVar21 = packssdw(_DAT_009aefe0,auVar18);
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar22,auVar21 ^ auVar22);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pCanonPerm[0xe] = '\x0e';
    }
    auVar21 = pshufhw(auVar18,auVar18,0x84);
    auVar21 = packssdw(auVar21 ^ auVar22,auVar21 ^ auVar22);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21._14_2_ >> 8 & 1) != 0) {
      pCanonPerm[0xf] = '\x0f';
    }
    if (nVars < 6) goto LAB_004d4aca;
  }
  uVar32 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    bVar17 = true;
    iVar50 = 0;
    iVar52 = 0;
    uVar6 = 0;
    if (fOnlySwap != 0) goto LAB_004d4ce4;
  }
  else {
    uVar14 = 0;
    iVar52 = 0;
    do {
      uVar7 = pTruth[uVar14];
      if (uVar7 != 0) {
        uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
        uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
        uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
        uVar7 = (uVar7 >> 8) + uVar7;
        lVar51 = (uVar7 >> 0x10) + uVar7;
        iVar52 = iVar52 + ((int)((ulong)lVar51 >> 0x20) + (int)lVar51 & 0xffU);
      }
      uVar14 = uVar14 + 1;
    } while (uVar32 != uVar14);
    bVar17 = fOnlySwap != 0;
    uVar6 = 0;
    iVar50 = iVar52;
    if ((bVar17) || (uVar6 = 0, iVar52 <= (int)(uVar11 * 0x20))) goto LAB_004d4ce4;
    uVar14 = 0;
    do {
      pTruth[uVar14] = ~pTruth[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar32 != uVar14);
  }
  uVar6 = 1 << (bVar8 & 0x1f);
  iVar50 = uVar11 * 0x40 - iVar52;
  bVar17 = false;
LAB_004d4ce4:
  Abc_TtCountOnesInCofs(pTruth,nVars,pStore);
  pStore[nVars] = iVar50;
  if (0 < nVars) {
    uVar14 = 0;
    do {
      iVar52 = iVar50 - pStore[uVar14];
      if (pStore[uVar14] < iVar52 && !bVar17) {
        if (uVar11 == 1) {
          bVar8 = (byte)(1 << ((byte)uVar14 & 0x1f));
          *pTruth = (s_Truths6[uVar14] & *pTruth) >> (bVar8 & 0x3f) |
                    *pTruth << (bVar8 & 0x3f) & s_Truths6[uVar14];
        }
        else if (uVar14 < 6) {
          if (0 < (int)uVar11) {
            uVar7 = s_Truths6[uVar14];
            uVar12 = 0;
            do {
              bVar8 = (byte)(1 << ((byte)uVar14 & 0x1f));
              pTruth[uVar12] =
                   (pTruth[uVar12] & uVar7) >> (bVar8 & 0x3f) |
                   pTruth[uVar12] << (bVar8 & 0x3f) & uVar7;
              uVar12 = uVar12 + 1;
            } while (uVar32 != uVar12);
          }
        }
        else if (0 < (int)uVar11) {
          bVar8 = (byte)(uVar14 - 6);
          uVar10 = 1 << (bVar8 & 0x1f);
          iVar53 = 2 << (bVar8 & 0x1f);
          uVar7 = 1;
          if (1 < (int)uVar10) {
            uVar7 = (ulong)uVar10;
          }
          pwVar15 = pTruth + (int)uVar10;
          pwVar16 = pTruth;
          do {
            if (uVar14 - 6 != 0x1f) {
              uVar12 = 0;
              do {
                wVar2 = pwVar16[uVar12];
                pwVar16[uVar12] = pwVar15[uVar12];
                pwVar15[uVar12] = wVar2;
                uVar12 = uVar12 + 1;
              } while (uVar7 != uVar12);
            }
            pwVar16 = pwVar16 + iVar53;
            pwVar15 = pwVar15 + iVar53;
          } while (pwVar16 < pTruth + (int)uVar11);
        }
        uVar6 = uVar6 | 1 << ((uint)uVar14 & 0x1f);
        pStore[uVar14] = iVar52;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar5);
    if (nVars != 1) {
      uVar14 = 2;
      uVar32 = 0;
      do {
        uVar7 = uVar32 + 1;
        if ((long)uVar32 < (long)nVars + -2) {
          uVar12 = uVar14;
          uVar13 = uVar7 & 0xffffffff;
          do {
            uVar9 = uVar12 & 0xffffffff;
            if (pStore[(int)uVar13] <= pStore[uVar12]) {
              uVar9 = uVar13;
            }
            uVar12 = uVar12 + 1;
            iVar50 = (int)uVar9;
            uVar13 = uVar9;
          } while (uVar5 != uVar12);
        }
        else {
          iVar50 = (int)uVar7;
        }
        if (pStore[iVar50] < pStore[uVar32]) {
          cVar1 = pCanonPerm[uVar32];
          pCanonPerm[uVar32] = pCanonPerm[iVar50];
          pCanonPerm[iVar50] = cVar1;
          iVar52 = pStore[uVar32];
          pStore[uVar32] = pStore[iVar50];
          pStore[iVar50] = iVar52;
          uVar6 = uVar6 ^ (1 << ((byte)iVar50 & 0x1f) ^ 1 << ((uint)uVar32 & 0x1f)) &
                          -((uVar6 >> ((byte)iVar50 & 0x1f) ^ uVar6 >> ((byte)uVar32 & 0x1f)) & 1);
          Abc_TtSwapVars(pTruth,nVars,(uint)uVar32,iVar50);
        }
        uVar14 = uVar14 + 1;
        uVar32 = uVar7;
      } while (uVar7 != nVars - 1);
    }
  }
  return uVar6;
}

Assistant:

static inline unsigned Abc_TtSemiCanonicize( word * pTruth, int nVars, char * pCanonPerm, int * pStoreOut, int fOnlySwap )
{
    int fUseOld = 1;
    int fOldSwap = 0;
    int pStoreIn[17];
    int * pStore = pStoreOut ? pStoreOut : pStoreIn;
    int i, nOnes, nWords = Abc_TtWordNum( nVars );
    unsigned uCanonPhase = 0;
    assert( nVars <= 16 );
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;

    if ( fUseOld )
    {
        // normalize polarity    
        nOnes = Abc_TtCountOnesInTruth( pTruth, nVars );
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }
    else
    {
        nOnes = Abc_TtCountOnesInCofsQuick( pTruth, nVars, pStore );
        // normalize polarity    
        if ( nOnes > nWords * 32 && !fOnlySwap )
        {
            for ( i = 0; i < nVars; i++ )
                pStore[i] = nWords * 32 - pStore[i]; 
            Abc_TtNot( pTruth, nWords );
            nOnes = nWords*64 - nOnes;
            uCanonPhase |= (1 << nVars);
        }
        // normalize phase
        pStore[nVars] = nOnes;
        for ( i = 0; i < nVars; i++ )
        {
            if ( pStore[i] >= nOnes - pStore[i] || fOnlySwap )
                continue;
            Abc_TtFlip( pTruth, nWords, i );
            uCanonPhase |= (1 << i);
            pStore[i] = nOnes - pStore[i]; 
        }
    }

    // normalize permutation
    if ( fOldSwap )
    {
        int fChange;
        do {
            fChange = 0;
            for ( i = 0; i < nVars-1; i++ )
            {
                if ( pStore[i] <= pStore[i+1] )
    //            if ( pStore[i] >= pStore[i+1] )
                    continue;
                ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
                ABC_SWAP( int, pStore[i], pStore[i+1] );
                if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> (i+1)) & 1) )
                {
                    uCanonPhase ^= (1 << i);
                    uCanonPhase ^= (1 << (i+1));
                }
                Abc_TtSwapAdjacent( pTruth, nWords, i );            
                fChange = 1;
    //            nSwaps++;
            }
        } 
        while ( fChange );
    }
    else
    {
        int k, BestK;
        for ( i = 0; i < nVars - 1; i++ )
        {
            BestK = i + 1;
            for ( k = i + 2; k < nVars; k++ )
                if ( pStore[BestK] > pStore[k] )
    //            if ( pStore[BestK] < pStore[k] )
                    BestK = k;
            if ( pStore[i] <= pStore[BestK] )
    //        if ( pStore[i] >= pStore[BestK] )
                continue;
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[BestK] );
            ABC_SWAP( int, pStore[i], pStore[BestK] );
            if ( ((uCanonPhase >> i) & 1) != ((uCanonPhase >> BestK) & 1) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << BestK);
            }
            Abc_TtSwapVars( pTruth, nVars, i, BestK );
    //        nSwaps++;
        }
    }
    return uCanonPhase;
}